

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopFissionPass::LoopFissionPass(LoopFissionPass *this)

{
  anon_class_1_0_00000001 local_11;
  LoopFissionPass *local_10;
  LoopFissionPass *this_local;
  
  local_10 = this;
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__LoopFissionPass_013be6f0;
  std::function<bool_(const_spvtools::opt::RegisterLiveness::RegionRegisterLiveness_&)>::function
            (&this->split_criteria_);
  this->split_multiple_times_ = false;
  std::function<bool(spvtools::opt::RegisterLiveness::RegionRegisterLiveness_const&)>::operator=
            ((function<bool(spvtools::opt::RegisterLiveness::RegionRegisterLiveness_const&)> *)
             &this->split_criteria_,&local_11);
  return;
}

Assistant:

LoopFissionPass::LoopFissionPass() : split_multiple_times_(false) {
  // Split by default.
  split_criteria_ = [](const RegisterLiveness::RegionRegisterLiveness&) {
    return true;
  };
}